

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setprop.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int in_EDI;
  char *in_stack_00000070;
  char *in_stack_00000078;
  int local_4;
  
  if (in_EDI == 3) {
    iVar1 = property_set(in_stack_00000078,in_stack_00000070);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      fprintf(_stderr,"could not set property\n");
      local_4 = 1;
    }
  }
  else {
    fprintf(_stderr,"usage: setprop <key> <value>\n");
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char *argv[])
{
    if(argc != 3) {
        fprintf(stderr,"usage: setprop <key> <value>\n");
        return 1;
    }

    if(property_set(argv[1], argv[2])){
        fprintf(stderr,"could not set property\n");
        return 1;
    }

    return 0;
}